

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O0

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  sunrealtype v;
  sunrealtype u;
  sunrealtype c1;
  void *user_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  **(double **)((long)ydot->content + 0x10) = dVar2 * -50.0;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 8) = dVar1 * 50.0;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 0x10) = dVar1 + dVar2;
  return 0;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype c1 = SUN_RCONST(50.0); /* problem constant */
  sunrealtype u  = NV_Ith_S(y, 0);   /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = -c1 * v;
  NV_Ith_S(ydot, 1) = c1 * u;
  NV_Ith_S(ydot, 2) = u + v;

  /* Return with success */
  return 0;
}